

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_eb21df::HandleTargetMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  bool bVar1;
  cmMakefile *pcVar2;
  cmTarget *target_00;
  string local_b8;
  cmTarget *local_98;
  cmTarget *target;
  allocator<char> local_79;
  string local_78;
  string *local_58;
  string *name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool remove_local;
  bool appendMode_local;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmExecutionStatus *status_local;
  
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(names);
  name = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(names);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&name);
    if (!bVar1) {
      return true;
    }
    local_58 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    bVar1 = cmMakefile::IsAlias(pcVar2,local_58);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"can not be used on an ALIAS target.",&local_79);
      cmExecutionStatus::SetError(status,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      return false;
    }
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    target_00 = cmMakefile::FindTargetToUse(pcVar2,local_58,false);
    local_98 = target_00;
    if (target_00 == (cmTarget *)0x0) {
      cmStrCat<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[40]>
                (&local_b8,(char (*) [23])"could not find TARGET ",local_58,
                 (char (*) [40])".  Perhaps it has not yet been created.");
      cmExecutionStatus::SetError(status,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      return false;
    }
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    bVar1 = HandleTarget(target_00,pcVar2,propertyName,propertyValue,appendAsString,appendMode,
                         remove);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove)
{
  for (std::string const& name : names) {
    if (status.GetMakefile().IsAlias(name)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
      // Handle the current target.
      if (!HandleTarget(target, status.GetMakefile(), propertyName,
                        propertyValue, appendAsString, appendMode, remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find TARGET ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}